

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O1

void __thiscall OpenMD::UniformField::modifyForces(UniformField *this)

{
  double *pdVar1;
  double dVar2;
  AtomType *pAVar3;
  DataStoragePointer DVar4;
  Snapshot *pSVar5;
  RealType RVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  uint i_1;
  Molecule *pMVar11;
  long lVar12;
  uint i_2;
  long lVar13;
  pointer ppAVar14;
  uint i_3;
  long lVar15;
  Atom *pAVar16;
  undefined4 uVar17;
  double tmp;
  undefined4 uVar18;
  Vector<double,_3U> result;
  FixedChargeAdapter fca;
  MoleculeIterator i;
  Vector3d r;
  Vector3d D;
  Vector<double,_3U> result_1;
  Vector3d f;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  Vector3d t;
  double local_1a0;
  double local_198 [4];
  FixedChargeAdapter local_178;
  MoleculeIterator local_170;
  Vector3d local_168;
  double local_148 [4];
  potVec local_128;
  double local_e8 [4];
  MultipoleAdapter local_c8;
  FluctuatingChargeAdapter local_c0;
  double local_b8 [4];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  potVec local_68;
  
  if (this->initialized == false) {
    initialize(this);
  }
  local_170._M_node = (_Base_ptr)0x0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_148[2] = 0.0;
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_168.super_Vector<double,_3U>.data_[2] = 0.0;
  local_168.super_Vector<double,_3U>.data_[0] = 0.0;
  local_168.super_Vector<double,_3U>.data_[1] = 0.0;
  if (this->doUniformField == true) {
    pMVar11 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_170);
    if (pMVar11 == (Molecule *)0x0) {
      local_1a0 = 0.0;
    }
    else {
      local_1a0 = 0.0;
      do {
        ppAVar14 = (pMVar11->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        while( true ) {
          if (ppAVar14 ==
              (pMVar11->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pAVar16 = (Atom *)0x0;
          }
          else {
            pAVar16 = *ppAVar14;
          }
          if (pAVar16 == (Atom *)0x0) break;
          pAVar3 = pAVar16->atomType_;
          lVar12 = *(long *)((long)&(((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar16->super_StuntDouble).storage_);
          lVar13 = (long)(pAVar16->super_StuntDouble).localIndex_;
          pdVar1 = (double *)(lVar12 + lVar13 * 0x18);
          local_168.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_168.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_168.super_Vector<double,_3U>.data_[2] = *(double *)(lVar12 + 0x10 + lVar13 * 0x18);
          Snapshot::wrapVector
                    (((this->super_ForceModifier).info_)->sman_->currentSnapshot_,&local_168);
          local_198[0] = 0.0;
          local_198[1] = 0.0;
          local_198[2] = 0.0;
          lVar12 = 0;
          do {
            local_198[lVar12] = (this->EF).super_Vector<double,_3U>.data_[lVar12] * 23.0609;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          local_128.data_[2] = local_198[2];
          local_128.data_[0] = local_198[0];
          local_128.data_[1] = local_198[1];
          lVar12 = (long)(pAVar16->super_StuntDouble).localIndex_ * 0x18 +
                   *(long *)((long)&(((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).electricField.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar16->super_StuntDouble).storage_);
          lVar13 = 0;
          do {
            *(double *)(lVar12 + lVar13 * 8) =
                 local_128.data_[lVar13] + *(double *)(lVar12 + lVar13 * 8);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          local_178.at_ = pAVar3;
          bVar9 = FixedChargeAdapter::isFixedCharge(&local_178);
          uVar17 = 0;
          uVar18 = 0;
          if (bVar9) {
            RVar6 = FixedChargeAdapter::getCharge(&local_178);
            uVar17 = SUB84(RVar6,0);
            uVar18 = (undefined4)((ulong)RVar6 >> 0x20);
          }
          local_198[3] = (double)CONCAT44(uVar18,uVar17);
          local_c0.at_ = pAVar3;
          bVar10 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_c0);
          dVar2 = local_198[3];
          if (bVar10) {
            DVar4 = (pAVar16->super_StuntDouble).storage_;
            pSVar5 = ((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar12 = (long)(pAVar16->super_StuntDouble).localIndex_;
            dVar2 = *(double *)
                     (*(long *)((long)&(pSVar5->atomData).flucQPos.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start + DVar4) + lVar12 * 8);
            dVar7 = 0.0;
            lVar13 = 0;
            do {
              dVar7 = dVar7 + local_168.super_Vector<double,_3U>.data_[lVar13] *
                              (this->EF).super_Vector<double,_3U>.data_[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            lVar13 = *(long *)((long)&(pSVar5->atomData).flucQFrc.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + DVar4);
            *(double *)(lVar13 + lVar12 * 8) = dVar7 * 23.0609 + *(double *)(lVar13 + lVar12 * 8);
            bVar9 = true;
            dVar2 = local_198[3] + dVar2;
          }
          if (bVar9 != false) {
            local_198[0] = 0.0;
            local_198[1] = 0.0;
            local_198[2] = 0.0;
            lVar12 = 0;
            do {
              local_198[lVar12] = (this->EF).super_Vector<double,_3U>.data_[lVar12] * dVar2;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_128.data_[0] = 0.0;
            local_128.data_[1] = 0.0;
            local_128.data_[2] = 0.0;
            lVar12 = 0;
            do {
              local_128.data_[lVar12] = local_198[lVar12] * 23.0609;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_e8[2] = local_128.data_[2];
            local_e8[0] = local_128.data_[0];
            local_e8[1] = local_128.data_[1];
            DVar4 = (pAVar16->super_StuntDouble).storage_;
            pSVar5 = ((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar12 = (long)(pAVar16->super_StuntDouble).localIndex_;
            lVar13 = lVar12 * 0x18 +
                     *(long *)((long)&(pSVar5->atomData).force.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + DVar4);
            lVar15 = 0;
            do {
              *(double *)(lVar13 + lVar15 * 8) = local_e8[lVar15] + *(double *)(lVar13 + lVar15 * 8)
              ;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            dVar2 = 0.0;
            lVar13 = 0;
            do {
              dVar2 = dVar2 + local_168.super_Vector<double,_3U>.data_[lVar13] * local_e8[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            if (this->doParticlePot == true) {
              lVar13 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + DVar4);
              *(double *)(lVar13 + lVar12 * 8) = *(double *)(lVar13 + lVar12 * 8) - dVar2;
            }
            local_1a0 = local_1a0 - dVar2;
          }
          local_c8.at_ = pAVar3;
          bVar9 = MultipoleAdapter::isDipole(&local_c8);
          if (bVar9) {
            lVar13 = (long)(pAVar16->super_StuntDouble).localIndex_;
            lVar12 = *(long *)((long)&(((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).dipole.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar16->super_StuntDouble).storage_);
            local_198[2] = *(double *)(lVar12 + 0x10 + lVar13 * 0x18);
            pdVar1 = (double *)(lVar12 + lVar13 * 0x18);
            local_198[0] = *pdVar1;
            local_198[1] = pdVar1[1];
            local_128.data_[0] = 0.0;
            local_128.data_[1] = 0.0;
            local_128.data_[2] = 0.0;
            lVar12 = 0;
            do {
              local_128.data_[lVar12] = local_198[lVar12] * 4.8018969509;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_148[2] = local_128.data_[2];
            local_148[0] = local_128.data_[0];
            local_148[1] = local_128.data_[1];
            dVar2 = (this->EF).super_Vector<double,_3U>.data_[0];
            dVar7 = (this->EF).super_Vector<double,_3U>.data_[1];
            dVar8 = (this->EF).super_Vector<double,_3U>.data_[2];
            local_b8[0] = dVar8 * local_128.data_[1] - local_128.data_[2] * dVar7;
            local_b8[1] = dVar2 * local_128.data_[2] - local_128.data_[0] * dVar8;
            local_b8[2] = local_128.data_[0] * dVar7 - dVar2 * local_128.data_[1];
            DVar4 = (pAVar16->super_StuntDouble).storage_;
            pSVar5 = ((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar12 = (long)(pAVar16->super_StuntDouble).localIndex_;
            lVar13 = lVar12 * 0x18 +
                     *(long *)((long)&(pSVar5->atomData).torque.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + DVar4);
            lVar15 = 0;
            do {
              *(double *)(lVar13 + lVar15 * 8) = local_b8[lVar15] + *(double *)(lVar13 + lVar15 * 8)
              ;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            dVar2 = 0.0;
            lVar13 = 0;
            do {
              dVar2 = dVar2 + local_148[lVar13] * (this->EF).super_Vector<double,_3U>.data_[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            if (this->doParticlePot == true) {
              lVar13 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + DVar4);
              *(double *)(lVar13 + lVar12 * 8) = *(double *)(lVar13 + lVar12 * 8) - dVar2;
            }
            local_1a0 = local_1a0 - dVar2;
          }
          ppAVar14 = ppAVar14 + 1;
        }
        pMVar11 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_170);
      } while (pMVar11 != (Molecule *)0x0);
    }
    pSVar5 = ((this->super_ForceModifier).info_)->sman_->currentSnapshot_;
    Snapshot::getLongRangePotentials(&local_128,pSVar5);
    local_78 = local_128.data_[0];
    dStack_70 = local_128.data_[1];
    local_88 = local_128.data_[5];
    dStack_80 = local_128.data_[6];
    local_98 = local_128.data_[3];
    dStack_90 = local_128.data_[4];
    local_68.data_[2] = local_1a0 + local_128.data_[2];
    local_68.data_[0] = local_128.data_[0];
    local_68.data_[1] = local_128.data_[1];
    local_68.data_[3] = local_128.data_[3];
    local_68.data_[4] = local_128.data_[4];
    local_68.data_[5] = local_128.data_[5];
    local_68.data_[6] = local_128.data_[6];
    Snapshot::setLongRangePotentials(pSVar5,&local_68);
  }
  return;
}

Assistant:

void UniformField::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);

    RealType C;
    Vector3d D;
    RealType U;
    RealType fPot;
    Vector3d t;
    Vector3d f;
    Vector3d r;

    bool isCharge;

    if (doUniformField) {
      U    = 0.0;
      fPot = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          // ad-hoc choice of the origin for potential calculation and
          // fluctuating charge force:

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          atom->addElectricField(EF * Constants::chargeFieldConvert);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF) * Constants::chargeFieldConvert);
          }

          if (isCharge) {
            f = EF * C * Constants::chargeFieldConvert;
            atom->addFrc(f);
            U = -dot(r, f);

            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            t = cross(D, EF);
            atom->addTrq(t);

            U = -dot(D, EF);

            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }